

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O3

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteBool(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            *this,bool b)

{
  char *pcVar1;
  char cVar2;
  undefined7 in_register_00000031;
  Stack<rapidjson::CrtAllocator> *this_00;
  char cVar3;
  char cVar4;
  
  this_00 = &this->os_->stack_;
  if ((int)CONCAT71(in_register_00000031,b) == 0) {
    if (this_00->stackEnd_ < this_00->stackTop_ + 5) {
      internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,5);
      this_00 = &this->os_->stack_;
    }
    pcVar1 = internal::Stack<rapidjson::CrtAllocator>::PushUnsafe<char>(this_00,1);
    *pcVar1 = 'f';
    this_00 = &this->os_->stack_;
    cVar2 = 's';
    cVar3 = 'l';
    cVar4 = 'a';
  }
  else {
    cVar2 = 'u';
    cVar3 = 'r';
    cVar4 = 't';
    if (this_00->stackEnd_ < this_00->stackTop_ + 4) {
      internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,4);
      this_00 = &this->os_->stack_;
    }
  }
  pcVar1 = internal::Stack<rapidjson::CrtAllocator>::PushUnsafe<char>(this_00,1);
  *pcVar1 = cVar4;
  pcVar1 = internal::Stack<rapidjson::CrtAllocator>::PushUnsafe<char>(&this->os_->stack_,1);
  *pcVar1 = cVar3;
  pcVar1 = internal::Stack<rapidjson::CrtAllocator>::PushUnsafe<char>(&this->os_->stack_,1);
  *pcVar1 = cVar2;
  pcVar1 = internal::Stack<rapidjson::CrtAllocator>::PushUnsafe<char>(&this->os_->stack_,1);
  *pcVar1 = 'e';
  return true;
}

Assistant:

bool WriteBool(bool b)  {
        if (b) {
            PutReserve(*os_, 4);
            PutUnsafe(*os_, 't'); PutUnsafe(*os_, 'r'); PutUnsafe(*os_, 'u'); PutUnsafe(*os_, 'e');
        }
        else {
            PutReserve(*os_, 5);
            PutUnsafe(*os_, 'f'); PutUnsafe(*os_, 'a'); PutUnsafe(*os_, 'l'); PutUnsafe(*os_, 's'); PutUnsafe(*os_, 'e');
        }
        return true;
    }